

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_prepared_api.cpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
TestExecutePrepared(Connection *con,string *query)

{
  undefined1 uVar1;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
  prepared;
  StringRef local_98;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  SourceLineInfo local_30;
  
  duckdb::Connection::Prepare((string *)&prepared);
  local_98.m_start = "REQUIRE";
  local_98.m_size = 7;
  local_30.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_prepared_api.cpp"
  ;
  local_30.line = 0x196;
  Catch::StringRef::StringRef(&local_40,"!prepared->HasError()");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_98,&local_30,local_40,Normal);
  duckdb::
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
  operator->(&prepared);
  uVar1 = duckdb::PreparedStatement::HasError();
  local_98.m_start = (char *)(CONCAT71(local_98.m_start._1_7_,uVar1) ^ 1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_98);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  duckdb::
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
  operator->(&prepared);
  duckdb::PreparedStatement::Execute<>((PreparedStatement *)con);
  std::unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>::
  ~unique_ptr(&prepared.
               super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
             );
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)con;
}

Assistant:

static duckdb::unique_ptr<QueryResult> TestExecutePrepared(Connection &con, string query) {
	auto prepared = con.Prepare(query);
	REQUIRE(!prepared->HasError());
	return prepared->Execute();
}